

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

double GenNorm(double *x,cupdlp_int n,cupdlp_float p)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if ((p == 2.0) && (!NAN(p))) {
    dVar3 = twoNorm(x,n);
    return dVar3;
  }
  if (INFINITY <= p) {
    dVar3 = infNorm(x,n);
    return dVar3;
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar2;
  }
  dVar3 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar4 = pow(ABS(x[uVar2]),p);
    dVar3 = dVar3 + dVar4;
  }
  dVar3 = pow(dVar3,1.0 / p);
  return dVar3;
}

Assistant:

double GenNorm(double *x, cupdlp_int n, cupdlp_float p) {
  if (p == 2.0) {
    return twoNorm(x, n);
  } else if (p == INFINITY) {
    return infNorm(x, n);
  } else {
    double nrm = 0.0;

    for (int i = 0; i < n; ++i) {
      nrm += pow(fabs(x[i]), p);
    }

    return pow(nrm, 1.0 / p);
  }
}